

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O3

SQRESULT sqstd_getfile(HSQUIRRELVM v,SQInteger idx,SQFILE *file)

{
  SQRESULT SVar1;
  SQFile *fileobj;
  SQUserPointer local_18;
  
  local_18 = (SQUserPointer)0x0;
  SVar1 = sq_getinstanceup(v,idx,&local_18,&DAT_80000001);
  if (SVar1 < 0) {
    SVar1 = sq_throwerror(v,"not a file");
  }
  else {
    *file = *(SQFILE *)((long)local_18 + 8);
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SQRESULT sqstd_getfile(HSQUIRRELVM v, SQInteger idx, SQFILE *file)
{
    SQFile *fileobj = NULL;
    if(SQ_SUCCEEDED(sq_getinstanceup(v,idx,(SQUserPointer*)&fileobj,(SQUserPointer)SQSTD_FILE_TYPE_TAG))) {
        *file = fileobj->GetHandle();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("not a file"));
}